

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>::
emplaceRealloc<slang::analysis::ClockInference::ExpansionInstance>
          (SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance> *this,pointer pos,
          ExpansionInstance *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  TimingControl *pTVar5;
  undefined8 uVar6;
  pointer pEVar7;
  pointer pEVar8;
  undefined7 uVar9;
  pointer pEVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar3 = this->cap;
  if (uVar12 < uVar3 * 2) {
    uVar12 = uVar3 * 2;
  }
  if (0x555555555555555 - uVar3 < uVar3) {
    uVar12 = 0x555555555555555;
  }
  lVar13 = (long)pos - (long)this->data_;
  pEVar10 = (pointer)operator_new(uVar12 * 0x18);
  *(undefined8 *)((long)pEVar10 + lVar13 + 0x10) = *(undefined8 *)&args->hasInferredClockArg;
  pTVar5 = args->clock;
  *(undefined8 *)((long)pEVar10 + lVar13) = args->expr;
  ((undefined8 *)((long)pEVar10 + lVar13))[1] = pTVar5;
  p = this->data_;
  sVar4 = this->len;
  lVar11 = (long)p + (sVar4 * 0x18 - (long)pos);
  pEVar7 = p;
  pEVar8 = pEVar10;
  if (lVar11 == 0) {
    if (sVar4 != 0) {
      lVar11 = 0;
      do {
        *(undefined8 *)(&pEVar10->hasInferredClockArg + lVar11) =
             *(undefined8 *)(&p->hasInferredClockArg + lVar11);
        puVar1 = (undefined8 *)((long)&p->expr + lVar11);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pEVar10->expr + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar11 = lVar11 + 0x18;
      } while (sVar4 * 0x18 != lVar11);
    }
  }
  else {
    for (; pEVar7 != pos; pEVar7 = pEVar7 + 1) {
      uVar9 = *(undefined7 *)&pEVar7->field_0x11;
      pEVar8->hasInferredClockArg = pEVar7->hasInferredClockArg;
      *(undefined7 *)&pEVar8->field_0x11 = uVar9;
      pTVar5 = pEVar7->clock;
      pEVar8->expr = pEVar7->expr;
      pEVar8->clock = pTVar5;
      pEVar8 = pEVar8 + 1;
    }
    memcpy((void *)((long)pEVar10 + lVar13 + 0x18),pos,((lVar11 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar12;
  this->data_ = pEVar10;
  return (pointer)((long)pEVar10 + lVar13);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}